

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchSim.c
# Opt level: O0

Dch_Cla_t * Dch_CreateCandEquivClasses(Aig_Man_t *pAig,int nWords,int fVerbose)

{
  int nEntries;
  Vec_Ptr_t *vSims_00;
  Dch_Cla_t *p;
  int local_2c;
  int i;
  Vec_Ptr_t *vSims;
  Dch_Cla_t *pClasses;
  int fVerbose_local;
  int nWords_local;
  Aig_Man_t *pAig_local;
  
  nEntries = Aig_ManObjNumMax(pAig);
  vSims_00 = Vec_PtrAllocSimInfo(nEntries,nWords);
  Dch_PerformRandomSimulation(pAig,vSims_00);
  p = Dch_ClassesStart(pAig);
  Dch_ClassesSetData(p,vSims_00,Dch_NodeHash,Dch_NodeIsConst,Dch_NodesAreEqual);
  Dch_ClassesPrepare(p,0,0);
  for (local_2c = 0; local_2c < 7; local_2c = local_2c + 1) {
    Dch_PerformRandomSimulation(pAig,vSims_00);
    Dch_ClassesRefine(p);
  }
  Vec_PtrFree(vSims_00);
  Dch_ClassesSetData(p,(void *)0x0,(_func_uint_void_ptr_Aig_Obj_t_ptr *)0x0,Dch_NodeIsConstCex,
                     Dch_NodesAreEqualCex);
  return p;
}

Assistant:

Dch_Cla_t * Dch_CreateCandEquivClasses( Aig_Man_t * pAig, int nWords, int fVerbose )
{
    Dch_Cla_t * pClasses;
    Vec_Ptr_t * vSims;
    int i;
    // allocate simulation information
    vSims = Vec_PtrAllocSimInfo( Aig_ManObjNumMax(pAig), nWords );
    // run random simulation from the primary inputs
    Dch_PerformRandomSimulation( pAig, vSims );
    // start storage for equivalence classes
    pClasses = Dch_ClassesStart( pAig );
    Dch_ClassesSetData( pClasses, vSims, Dch_NodeHash, Dch_NodeIsConst, Dch_NodesAreEqual );
    // hash nodes by sim info
    Dch_ClassesPrepare( pClasses, 0, 0 );
    // iterate random simulation
    for ( i = 0; i < 7; i++ )
    {
        Dch_PerformRandomSimulation( pAig, vSims );
        Dch_ClassesRefine( pClasses );
    }
    // clean up and return
    Vec_PtrFree( vSims );
    // prepare class refinement procedures
    Dch_ClassesSetData( pClasses, NULL, NULL, Dch_NodeIsConstCex, Dch_NodesAreEqualCex );
    return pClasses;
}